

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

string * __thiscall
deqp::gls::BuiltinPrecisionTests::intervalToString<tcu::Matrix<float,3,2>>
          (string *__return_storage_ptr__,BuiltinPrecisionTests *this,FloatFormat *fmt,IVal *ival)

{
  ostringstream oss;
  ostringstream local_220 [112];
  ios_base local_1b0 [264];
  Matrix<tcu::Interval,_3,_2> local_a8;
  
  std::__cxx11::ostringstream::ostringstream(local_220);
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix(&local_a8,(Matrix<tcu::Interval,_3,_2> *)fmt);
  ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doPrintIVal
            ((FloatFormat *)this,&local_a8,(ostream *)local_220);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_220);
  std::ios_base::~ios_base(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

string intervalToString (const FloatFormat& fmt, const typename Traits<T>::IVal& ival)
{
	ostringstream oss;
	printIVal<T>(fmt, ival, oss);
	return oss.str();
}